

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O0

void __thiscall VPath::VPathData::reserve(VPathData *this,size_t pts,size_t elms)

{
  size_type sVar1;
  size_type sVar2;
  long in_RDX;
  long in_RSI;
  vector<VPointF,_std::allocator<VPointF>_> *in_RDI;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *unaff_retaddr;
  vector<VPointF,_std::allocator<VPointF>_> *__n;
  
  __n = in_RDI;
  sVar1 = std::vector<VPointF,_std::allocator<VPointF>_>::capacity(in_RDI);
  sVar2 = std::vector<VPointF,_std::allocator<VPointF>_>::size(in_RDI);
  if (sVar1 < sVar2 + in_RSI) {
    std::vector<VPointF,_std::allocator<VPointF>_>::size(in_RDI);
    std::vector<VPointF,_std::allocator<VPointF>_>::reserve
              ((vector<VPointF,_std::allocator<VPointF>_> *)unaff_retaddr,(size_type)__n);
  }
  sVar1 = std::vector<VPath::Element,_std::allocator<VPath::Element>_>::capacity
                    ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)(in_RDI + 1));
  sVar2 = std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size
                    ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)(in_RDI + 1));
  if (sVar1 < sVar2 + in_RDX) {
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size
              ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)(in_RDI + 1));
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::reserve
              (unaff_retaddr,(size_type)__n);
  }
  return;
}

Assistant:

void VPath::VPathData::reserve(size_t pts, size_t elms)
{
    if (m_points.capacity() < m_points.size() + pts)
        m_points.reserve(m_points.size() + pts);
    if (m_elements.capacity() < m_elements.size() + elms)
        m_elements.reserve(m_elements.size() + elms);
}